

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiWindow_*> *this_00;
  ImVec2 IVar1;
  uint move_flags;
  _func_void_int_int *p_Var2;
  char *text;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *ctx;
  bool bVar5;
  bool bVar6;
  ImGuiKeyModFlags IVar7;
  int iVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow **ppIVar10;
  char *pcVar11;
  int i;
  char *label;
  int iVar12;
  ImGuiContext *g;
  ImGuiDir clip_dir;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect local_48;
  
  ctx = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x1096,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x109b,"void ImGui::EndFrame()");
  }
  CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
  pIVar4 = GImGui;
  IVar7 = GetMergedKeyModFlags();
  if ((IVar7 != 0) && ((pIVar4->IO).KeyMods != IVar7)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x1b53,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar12 = (pIVar4->CurrentWindowStack).Size;
  if (iVar12 != 1) {
    if (1 < iVar12) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x1b5f,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x1b65,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((pIVar4->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x1b69,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var2 = (ctx->IO).ImeSetInputScreenPosFn;
  if (p_Var2 != (_func_void_int_int *)0x0) {
    fVar16 = (ctx->PlatformImeLastPos).x;
    if ((fVar16 != 3.4028235e+38) || (NAN(fVar16))) {
      fVar15 = (ctx->PlatformImePos).x;
      fVar14 = (ctx->PlatformImePos).y;
      fVar17 = (ctx->PlatformImeLastPos).y - fVar14;
      if ((fVar16 - fVar15) * (fVar16 - fVar15) + fVar17 * fVar17 <= 0.0001) goto LAB_0011f519;
    }
    else {
      fVar15 = (ctx->PlatformImePos).x;
      fVar14 = (ctx->PlatformImePos).y;
    }
    (*p_Var2)((int)fVar15,(int)fVar14);
    ctx->PlatformImeLastPos = ctx->PlatformImePos;
  }
LAB_0011f519:
  ctx->WithinFrameScopeWithImplicitWindow = false;
  pIVar9 = ctx->CurrentWindow;
  if ((pIVar9 != (ImGuiWindow *)0x0) && (pIVar9->WriteAccessed == false)) {
    pIVar9->Active = false;
  }
  End();
  pIVar4 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar9 = FindWindowByName("###NavWindowingList");
      pIVar4->NavWindowingListWindow = pIVar9;
    }
    IVar1 = (pIVar4->IO).DisplaySize;
    fVar16 = IVar1.x;
    fVar15 = IVar1.y;
    IVar3.y = fVar15 * 0.2;
    IVar3.x = fVar16 * 0.2;
    (pIVar4->NextWindowData).SizeConstraintRect.Min = IVar3;
    (pIVar4->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar4->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar4->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar4->NextWindowData).SizeCallbackUserData = (void *)0x0;
    *(byte *)&(pIVar4->NextWindowData).Flags = (byte)(pIVar4->NextWindowData).Flags | 0x11;
    IVar1.y = fVar15 * 0.5;
    IVar1.x = fVar16 * 0.5;
    (pIVar4->NextWindowData).PosVal = IVar1;
    (pIVar4->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar4->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar4->NextWindowData).PosCond = 1;
    IVar1 = (pIVar4->Style).WindowPadding;
    fVar16 = IVar1.x;
    fVar15 = IVar1.y;
    local_48.Min.y = fVar15 + fVar15;
    local_48.Min.x = fVar16 + fVar16;
    PushStyleVar(1,&local_48.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    iVar12 = (pIVar4->WindowsFocusOrder).Size;
    while (0 < iVar12) {
      iVar12 = iVar12 + -1;
      ppIVar10 = ImVector<ImGuiWindow_*>::operator[](&pIVar4->WindowsFocusOrder,iVar12);
      pIVar9 = *ppIVar10;
      bVar5 = IsWindowNavFocusable(pIVar9);
      if (bVar5) {
        text = pIVar9->Name;
        pcVar11 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar11) {
          label = "(Popup)";
          if (((uint)pIVar9->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar9->Flags >> 10 & 1) != 0) {
              iVar8 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar8 == 0) goto LAB_0011f6a0;
            }
            label = "(Untitled)";
          }
        }
LAB_0011f6a0:
        local_48.Min.x = 0.0;
        local_48.Min.y = 0.0;
        Selectable(label,pIVar4->NavWindowingTarget == pIVar9,0,&local_48.Min);
      }
    }
    End();
    PopStyleVar(1);
  }
  pIVar9 = pIVar4->NavWrapRequestWindow;
  if ((pIVar9 != (ImGuiWindow *)0x0) && (pIVar4->NavWindow == pIVar9)) {
    move_flags = pIVar4->NavWrapRequestFlags;
    bVar5 = NavMoveRequestButNoResultYet();
    if ((bVar5) &&
       ((pIVar4->NavMoveRequestForward == ImGuiNavForward_None &&
        (pIVar4->NavLayer == ImGuiNavLayer_Main)))) {
      if (move_flags == 0) {
        __assert_fail("move_flags != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x2413,"void ImGui::NavEndFrame()");
      }
      local_48.Min = pIVar9->NavRectRel[0].Min;
      local_48.Max = pIVar9->NavRectRel[0].Max;
      iVar12 = pIVar4->NavMoveDir;
      clip_dir = iVar12;
      if (iVar12 == 0) {
        if ((move_flags & 5) != 0) {
          fVar16 = (pIVar9->SizeFull).x;
          fVar15 = (pIVar9->WindowPadding).x;
          fVar15 = fVar15 + fVar15 + (pIVar9->ContentSize).x;
          uVar13 = -(uint)(fVar15 <= fVar16);
          fVar16 = (float)(uVar13 & (uint)fVar16 | ~uVar13 & (uint)fVar15) - (pIVar9->Scroll).x;
          clip_dir = 0;
          if ((move_flags & 4) != 0) {
            fVar15 = local_48.Max.y - local_48.Min.y;
            local_48.Min.y = local_48.Min.y - fVar15;
            local_48.Max.y = local_48.Max.y - fVar15;
            clip_dir = 2;
          }
          local_48.Max.x = fVar16;
          local_48.Min.x = fVar16;
          NavMoveRequestForward(0,clip_dir,&local_48,move_flags);
          iVar12 = pIVar4->NavMoveDir;
          goto LAB_0011f7db;
        }
        iVar12 = 0;
        clip_dir = 0;
      }
      else {
LAB_0011f7db:
        if (iVar12 == 1 && (move_flags & 5) != 0) {
          fVar16 = (pIVar9->Scroll).x;
          fVar14 = local_48.Max.y;
          local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar16) ^ 0x80000000);
          fVar15 = local_48.Min.y;
          local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar16) ^ 0x80000000);
          if ((move_flags & 4) != 0) {
            fVar16 = fVar14 - fVar15;
            local_48.Min.y = fVar15 + fVar16;
            local_48.Max.y = fVar16 + fVar14;
            clip_dir = 3;
          }
          NavMoveRequestForward(1,clip_dir,&local_48,move_flags);
          iVar12 = pIVar4->NavMoveDir;
        }
      }
      if ((move_flags & 10) != 0 && iVar12 == 2) {
        fVar16 = (pIVar9->SizeFull).y;
        fVar15 = (pIVar9->WindowPadding).y;
        fVar15 = fVar15 + fVar15 + (pIVar9->ContentSize).y;
        uVar13 = -(uint)(fVar15 <= fVar16);
        fVar16 = (float)(uVar13 & (uint)fVar16 | ~uVar13 & (uint)fVar15) - (pIVar9->Scroll).y;
        if ((move_flags & 8) != 0) {
          fVar15 = local_48.Max.x - local_48.Min.x;
          local_48.Min.x = local_48.Min.x - fVar15;
          local_48.Max.x = local_48.Max.x - fVar15;
          clip_dir = 0;
        }
        local_48.Max.y = fVar16;
        local_48.Min.y = fVar16;
        NavMoveRequestForward(2,clip_dir,&local_48,move_flags);
        iVar12 = pIVar4->NavMoveDir;
      }
      if (iVar12 == 3 && (move_flags & 10) != 0) {
        fVar16 = (pIVar9->Scroll).y;
        fVar14 = local_48.Max.x;
        local_48.Max = (ImVec2)(CONCAT44(fVar16,local_48.Max.x) ^ 0x8000000000000000);
        fVar15 = local_48.Min.x;
        local_48.Min = (ImVec2)(CONCAT44(fVar16,local_48.Min.x) ^ 0x8000000000000000);
        if ((move_flags & 8) != 0) {
          clip_dir = 1;
          fVar16 = fVar14 - fVar15;
          local_48.Min.x = fVar15 + fVar16;
          local_48.Max.x = fVar16 + fVar14;
        }
        NavMoveRequestForward(3,clip_dir,&local_48,move_flags);
      }
    }
  }
  if (ctx->DragDropActive != true) goto LAB_0011f9a0;
  bVar5 = (ctx->DragDropPayload).Delivery;
  if ((ctx->DragDropPayload).DataFrameCount + 1 < ctx->FrameCount) {
    if ((ctx->DragDropSourceFlags & 0x20) == 0) {
      bVar6 = IsMouseDown(ctx->DragDropMouseButton);
      bVar6 = !bVar6;
      goto LAB_0011f992;
    }
  }
  else {
    bVar6 = false;
LAB_0011f992:
    if ((!bVar6) && (bVar5 == false)) goto LAB_0011f9a0;
  }
  ClearDragDrop();
LAB_0011f9a0:
  iVar12 = ctx->FrameCount;
  if (((ctx->DragDropActive == true) && (ctx->DragDropSourceFrameCount < iVar12)) &&
     ((ctx->DragDropSourceFlags & 1) == 0)) {
    ctx->DragDropWithinSource = true;
    SetTooltip("...");
    ctx->DragDropWithinSource = false;
    iVar12 = ctx->FrameCount;
  }
  ctx->WithinFrameScope = false;
  ctx->FrameCountEnded = iVar12;
  UpdateMouseMovingWindowEndFrame();
  this = &ctx->WindowsTempSortBuffer;
  ImVector<ImGuiWindow_*>::resize(this,0);
  this_00 = &ctx->Windows;
  ImVector<ImGuiWindow_*>::reserve(this,(ctx->Windows).Size);
  for (iVar12 = 0; iVar12 != this_00->Size; iVar12 = iVar12 + 1) {
    ppIVar10 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar12);
    pIVar9 = *ppIVar10;
    if ((pIVar9->Active != true) || ((pIVar9->Flags & 0x1000000) == 0)) {
      AddWindowToSortBuffer(this,pIVar9);
    }
  }
  if (this->Size == iVar12) {
    ImVector<ImGuiWindow_*>::swap(this_00,this);
    (ctx->IO).MetricsActiveWindows = ctx->WindowsActiveCount;
    ((ctx->IO).Fonts)->Locked = false;
    (ctx->IO).MouseWheel = 0.0;
    (ctx->IO).MouseWheelH = 0.0;
    ImVector<unsigned_short>::resize(&(ctx->IO).InputQueueCharacters,0);
    (ctx->IO).NavInputs[0x10] = 0.0;
    (ctx->IO).NavInputs[0x11] = 0.0;
    (ctx->IO).NavInputs[0x12] = 0.0;
    (ctx->IO).NavInputs[0x13] = 0.0;
    (ctx->IO).NavInputs[0xc] = 0.0;
    (ctx->IO).NavInputs[0xd] = 0.0;
    (ctx->IO).NavInputs[0xe] = 0.0;
    (ctx->IO).NavInputs[0xf] = 0.0;
    (ctx->IO).NavInputs[8] = 0.0;
    (ctx->IO).NavInputs[9] = 0.0;
    (ctx->IO).NavInputs[10] = 0.0;
    (ctx->IO).NavInputs[0xb] = 0.0;
    (ctx->IO).NavInputs[4] = 0.0;
    (ctx->IO).NavInputs[5] = 0.0;
    (ctx->IO).NavInputs[6] = 0.0;
    (ctx->IO).NavInputs[7] = 0.0;
    (ctx->IO).NavInputs[0] = 0.0;
    (ctx->IO).NavInputs[1] = 0.0;
    (ctx->IO).NavInputs[2] = 0.0;
    (ctx->IO).NavInputs[3] = 0.0;
    (ctx->IO).NavInputs[0x14] = 0.0;
    CallContextHooks(ctx,ImGuiContextHookType_EndFramePost);
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x10d6,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}